

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void allocate_mc_tmp_buf(AV1_COMMON *cm,ThreadData *thread_data,int buf_size,int use_highbd)

{
  void *pvVar1;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  uint16_t *hbd_mc_buf;
  int ref;
  int local_2c;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
    if (in_ECX == 0) {
      pvVar1 = aom_memalign((ulong)in_EDX << 0x20,CONCAT44(iVar2,in_stack_ffffffffffffffe0));
      *(void **)(in_RSI + 0x3eb68 + (long)iVar2 * 8) = pvVar1;
      if (*(long *)(in_RSI + 0x3eb68 + (long)iVar2 * 8) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate thread_data->mc_buf[ref]");
      }
      memset(*(void **)(in_RSI + 0x3eb68 + (long)iVar2 * 8),0,(long)(int)in_EDX);
    }
    else {
      pvVar1 = aom_memalign(CONCAT44(in_EDX,in_ECX),CONCAT44(iVar2,in_stack_ffffffffffffffe0));
      if (pvVar1 == (void *)0x0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate hbd_mc_buf");
      }
      memset(pvVar1,0,(long)(int)in_EDX);
      *(ulong *)(in_RSI + 0x3eb68 + (long)iVar2 * 8) = (ulong)pvVar1 >> 1;
    }
  }
  *(uint *)(in_RSI + 0x3eb80) = in_EDX;
  *(int *)(in_RSI + 0x3eb84) = in_ECX;
  pvVar1 = aom_memalign(CONCAT44(in_EDX,in_ECX),CONCAT44(iVar2,in_stack_ffffffffffffffe0));
  *(void **)(in_RSI + 0x3eb88) = pvVar1;
  if (*(long *)(in_RSI + 0x3eb88) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate thread_data->tmp_conv_dst");
  }
  pvVar1 = aom_memalign(CONCAT44(in_EDX,in_ECX),CONCAT44(iVar2,in_stack_ffffffffffffffe0));
  *(void **)(in_RSI + 0x3eb78) = pvVar1;
  if (*(long *)(in_RSI + 0x3eb78) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate thread_data->seg_mask");
  }
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    pvVar1 = aom_memalign(CONCAT44(in_EDX,in_ECX),CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    *(void **)(in_RSI + 0x3eb90 + (long)local_2c * 8) = pvVar1;
    if (*(long *)(in_RSI + 0x3eb90 + (long)local_2c * 8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate thread_data->tmp_obmc_bufs[i]");
    }
  }
  return;
}

Assistant:

static inline void allocate_mc_tmp_buf(AV1_COMMON *const cm,
                                       ThreadData *thread_data, int buf_size,
                                       int use_highbd) {
  for (int ref = 0; ref < 2; ref++) {
    // The mc_buf/hbd_mc_buf must be zeroed to fix a intermittent valgrind error
    // 'Conditional jump or move depends on uninitialised value' from the loop
    // filter. Uninitialized reads in convolve function (e.g. horiz_4tap path in
    // av1_convolve_2d_sr_avx2()) from mc_buf/hbd_mc_buf are seen to be the
    // potential reason for this issue.
    if (use_highbd) {
      uint16_t *hbd_mc_buf;
      CHECK_MEM_ERROR(cm, hbd_mc_buf, (uint16_t *)aom_memalign(16, buf_size));
      memset(hbd_mc_buf, 0, buf_size);
      thread_data->mc_buf[ref] = CONVERT_TO_BYTEPTR(hbd_mc_buf);
    } else {
      CHECK_MEM_ERROR(cm, thread_data->mc_buf[ref],
                      (uint8_t *)aom_memalign(16, buf_size));
      memset(thread_data->mc_buf[ref], 0, buf_size);
    }
  }
  thread_data->mc_buf_size = buf_size;
  thread_data->mc_buf_use_highbd = use_highbd;

  CHECK_MEM_ERROR(cm, thread_data->tmp_conv_dst,
                  aom_memalign(32, MAX_SB_SIZE * MAX_SB_SIZE *
                                       sizeof(*thread_data->tmp_conv_dst)));
  CHECK_MEM_ERROR(cm, thread_data->seg_mask,
                  (uint8_t *)aom_memalign(
                      16, 2 * MAX_SB_SQUARE * sizeof(*thread_data->seg_mask)));

  for (int i = 0; i < 2; ++i) {
    CHECK_MEM_ERROR(
        cm, thread_data->tmp_obmc_bufs[i],
        aom_memalign(16, 2 * MAX_MB_PLANE * MAX_SB_SQUARE *
                             sizeof(*thread_data->tmp_obmc_bufs[i])));
  }
}